

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_maps_iterator.cc
# Opt level: O1

bool tcmalloc::DoForEachProcMapping(_func_void_ProcMapping_ptr_void_ptr *body,void *arg)

{
  char **__src;
  bool bVar1;
  int __fd;
  int *piVar2;
  char **ppcVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  char ***in_RCX;
  char ***pppcVar7;
  bool bVar8;
  int iVar9;
  size_t __n;
  char **in_R8;
  byte bVar10;
  char **__s;
  char **ppcVar11;
  char *local_1498;
  char buf [5120];
  unsigned_long local_90;
  char *local_88;
  unsigned_long local_80;
  long local_78;
  char *local_70;
  void *local_68;
  _func_void_ProcMapping_ptr_void_ptr *local_60;
  char local_52 [4];
  undefined1 local_4e;
  char flags_tmp [10];
  char *endptr_1;
  char **local_38;
  char *endptr;
  
  local_68 = arg;
  local_60 = body;
  do {
    __fd = open("/proc/self/maps",0);
    if (-1 < __fd) {
      __s = &local_1498;
      bVar8 = false;
      ppcVar11 = __s;
      goto LAB_001199d2;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  goto LAB_00119c32;
LAB_001199d2:
  do {
    ppcVar3 = (char **)memchr(__s,10,(long)ppcVar11 - (long)__s);
    if (ppcVar3 == (char **)0x0) {
      iVar9 = (int)((long)ppcVar11 - (long)__s);
      if (bVar8) {
        if (iVar9 == 0) {
          uVar5 = 1;
        }
        else {
          *(char *)ppcVar11 = '\n';
          ppcVar11 = (char **)((long)ppcVar11 + 1);
          uVar5 = 0;
        }
      }
      else {
        __n = (size_t)iVar9;
        memmove(&local_1498,__s,__n);
        do {
          uVar4 = read(__fd,(void *)((long)&local_1498 + __n),0x13ff - __n);
          iVar9 = (int)uVar4;
          if (-1 < iVar9) break;
          piVar2 = __errno_location();
        } while (*piVar2 == 4);
        uVar5 = 0;
        uVar4 = uVar4 & 0xffffffff;
        if (iVar9 < 1) {
          uVar4 = uVar5;
        }
        in_RCX = (char ***)0x1;
        if (iVar9 < 1) {
          bVar8 = true;
        }
        ppcVar11 = (char **)((long)((long)&local_1498 + __n) + uVar4);
        __s = &local_1498;
      }
    }
    else {
      if (ppcVar11 <= ppcVar3) {
        syscall(1,2,"Check failed: nextline < ebuf: BUG\n",0x23);
        abort();
      }
      *(char *)ppcVar3 = '\0';
      local_38 = __s;
      if ((__s == (char **)0x0) || (*(char *)__s == '\0')) {
LAB_00119bc6:
        uVar4 = 0;
        bVar10 = 0;
      }
      else {
        bVar1 = anon_unknown_0::StringToIntegerUntilCharWithCheck<unsigned_long>
                          ((unsigned_long *)(buf + 0x13f8),(char *)0x2d,(int)&local_38,(int)in_RCX,
                           in_R8);
        if ((!bVar1) ||
           (bVar1 = anon_unknown_0::StringToIntegerUntilCharWithCheck<unsigned_long>
                              (&local_90,(char *)0x20,(int)&local_38,(int)in_RCX,in_R8),
           __src = local_38, !bVar1)) goto LAB_00119bc6;
        bVar1 = anon_unknown_0::ExtractUntilChar((char *)local_38,0x20,(char **)(flags_tmp + 2));
        if (bVar1) {
          strncpy(local_52,(char *)__src,5);
          local_4e = 0;
          *(undefined1 *)flags_tmp._2_8_ = 0x20;
          anon_unknown_0::SkipWhileWhitespace((char **)(flags_tmp + 2),0x20);
          local_38 = (char **)flags_tmp._2_8_;
        }
        else {
          local_38 = (char **)0x0;
        }
        if ((local_38 == (char **)0x0) || (*(char *)local_38 == '\0')) goto LAB_00119bc6;
        local_38 = (char **)((long)local_38 + 1);
        pppcVar7 = &local_38;
        bVar1 = anon_unknown_0::StringToIntegerUntilCharWithCheck<unsigned_long>
                          (&local_80,(char *)0x20,(int)pppcVar7,(int)in_RCX,in_R8);
        if (!bVar1) goto LAB_00119bc6;
        bVar1 = anon_unknown_0::StringToIntegerUntilCharWithCheck<long>
                          ((long *)(flags_tmp + 2),(char *)0x10,0x3a,(int)pppcVar7,in_R8);
        in_RCX = pppcVar7;
        if (!bVar1) goto LAB_00119bc6;
        pppcVar7 = &local_38;
        in_RCX = pppcVar7;
        bVar1 = anon_unknown_0::StringToIntegerUntilCharWithCheck<long>
                          ((long *)(flags_tmp + 2),(char *)0x10,0x20,(int)pppcVar7,in_R8);
        if ((!bVar1) ||
           (bVar1 = anon_unknown_0::StringToIntegerUntilCharWithCheck<long>
                              (&local_78,(char *)0xa,0x20,(int)pppcVar7,in_R8), in_RCX = pppcVar7,
           !bVar1)) goto LAB_00119bc6;
        uVar4 = (ulong)(uint)((int)local_38 - (int)__s);
        bVar10 = 1;
      }
      if (bVar10 == 0) {
        uVar6 = (int)ppcVar3 - (int)__s;
        in_RCX = (char ***)(ulong)uVar6;
        in_R8 = __s;
        fprintf(_stderr,"bad line %d:\n%.*s\n----\n",(ulong)uVar6);
      }
      else {
        local_70 = (char *)(uVar4 + (long)__s);
        local_88 = local_52;
        (*local_60)((ProcMapping *)(buf + 0x13f8),local_68);
      }
      uVar5 = (ulong)(bVar10 ^ 1);
      if (bVar10 != 0) {
        __s = (char **)((long)ppcVar3 + 1);
      }
    }
  } while ((char)uVar5 == '\0');
  close(__fd);
LAB_00119c32:
  return -1 < __fd;
}

Assistant:

bool DoForEachProcMapping(void (*body)(const ProcMapping& mapping, void* arg), void* arg) {
#if defined TCMALLOC_WANT_DL_ITERATE_PHDR
  auto callback = [&] (struct dl_phdr_info *info, size_t _size) -> int {
    ProcMapping mapping;
    memset(&mapping, 0, sizeof(mapping));
    uintptr_t addr = info->dlpi_addr;
    if (!info->dlpi_name || info->dlpi_name[0] == 0) {
      mapping.filename = tcmalloc::GetProgramInvocationName();
      if (!mapping.filename) {
        mapping.filename = "";
      }
    } else {
      mapping.filename = info->dlpi_name;
    }
    for (int i = 0; i < info->dlpi_phnum; i++) {
      auto phdr = info->dlpi_phdr + i;
      if (phdr->p_type != PT_LOAD) {
        continue;
      }
      uint64_t vaddr = phdr->p_vaddr + addr;
      uint64_t align = phdr->p_align;
      uint64_t offset = phdr->p_offset;
      uint64_t size = phdr->p_filesz;
      uint64_t start_adj = vaddr & (align - 1); // amount we need to round down to align start
      uint64_t end_adj = (~(vaddr + size) + 1) & (align - 1); // likewise, but for end of mapping

      vaddr -= start_adj;
      offset -= start_adj;
      size += start_adj + end_adj;
      CHECK_EQ((size & (align - 1)), 0);

      char flags[5] = "---p";
      auto fl = phdr->p_flags;
      if ((fl & PF_R)) {
        flags[0] = 'r';
      }
      if ((fl & PF_W)) {
        flags[1] = 'w';
      }
      if ((fl & PF_X)) {
        flags[2] = 'x';
      }

      mapping.start = vaddr;
      mapping.end = vaddr + size;
      mapping.flags = flags;
      mapping.offset = offset;
      mapping.inode = 0;

      body(mapping, arg);
    }

    return 0;
  };

  tcmalloc::FunctionRef<int(struct dl_phdr_info *, size_t)> ref{callback};
  (void)dl_iterate_phdr(ref.fn, ref.data);

  return true;
#elif defined(PLATFORM_WINDOWS)
  return DoIterateWindows(body, arg);
#elif defined(__MACH__)
  return DoIterateOSX(body, arg);
#elif defined(__sun__)
  return DoIterateSolaris(body, arg);
#elif defined(__QNXNTO__)
  return DoIterateQNX(body, arg);
#elif defined(__FreeBSD__)
  return DoIterateFreeBSD(body, arg);
#else
  return DoIterateLinux("/proc/self/maps", body, arg);
#endif
}